

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O1

DirectionCone * RandomCone(DirectionCone *__return_storage_ptr__,RNG *rng)

{
  undefined8 uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  float __x;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_ZMM4 [64];
  undefined1 local_58 [16];
  float local_28;
  undefined1 extraout_var [60];
  
  auVar10 = in_ZMM4._0_16_;
  uVar2 = rng->state;
  uVar4 = uVar2 * 0x5851f42d4c957f2d + rng->inc;
  rng->state = uVar4 * 0x5851f42d4c957f2d + rng->inc;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar2;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar4;
  auVar9 = vpunpcklqdq_avx(auVar12,auVar7);
  auVar6 = vpsrlvq_avx2(auVar9,_DAT_005655d0);
  auVar7 = vpsrlvq_avx2(auVar9,_DAT_005655c0);
  auVar6 = vpshufd_avx(auVar7 ^ auVar6,0xe8);
  auVar9 = vpsrlq_avx(auVar9,0x3b);
  auVar9 = vpshufd_avx(auVar9,0xe8);
  auVar6 = vprorvd_avx512vl(auVar6,auVar9);
  auVar9 = vcvtudq2ps_avx512vl(auVar6);
  auVar6._8_4_ = 0x2f800000;
  auVar6._0_8_ = 0x2f8000002f800000;
  auVar6._12_4_ = 0x2f800000;
  auVar7 = vmulps_avx512vl(auVar9,auVar6);
  auVar9._8_4_ = 0x3f7fffff;
  auVar9._0_8_ = 0x3f7fffff3f7fffff;
  auVar9._12_4_ = 0x3f7fffff;
  uVar2 = vcmpps_avx512vl(auVar7,auVar9,1);
  bVar5 = (byte)(uVar2 >> 1);
  auVar6 = vmovshdup_avx(auVar7);
  auVar9 = vfmadd132ss_fma(ZEXT416((uint)(bVar5 & 1) * auVar6._0_4_ +
                                   (uint)!(bool)(bVar5 & 1) * 0x3f7fffff),
                           SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000));
  auVar6 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar9,auVar9);
  auVar6 = vmaxss_avx(auVar6,ZEXT816(0) << 0x20);
  if (auVar6._0_4_ < 0.0) {
    fVar8 = sqrtf(auVar6._0_4_);
  }
  else {
    auVar6 = vsqrtss_avx(auVar6,auVar6);
    fVar8 = auVar6._0_4_;
  }
  __x = (float)((uint)((byte)uVar2 & 1) * (int)(auVar7._0_4_ * 6.2831855) +
               (uint)!(bool)((byte)uVar2 & 1) * 0x40c90fda);
  local_58._0_4_ = cosf(__x);
  local_58._4_4_ = extraout_XMM0_Db;
  local_58._8_4_ = extraout_XMM0_Dc;
  local_58._12_4_ = extraout_XMM0_Dd;
  auVar11._0_4_ = sinf(__x);
  auVar11._4_60_ = extraout_var;
  uVar2 = rng->state;
  rng->state = uVar2 * 0x5851f42d4c957f2d + rng->inc;
  uVar3 = (uint)(uVar2 >> 0x2d) ^ (uint)(uVar2 >> 0x1b);
  bVar5 = (byte)(uVar2 >> 0x3b);
  auVar6 = vcvtusi2ss_avx512f(auVar10,uVar3 >> bVar5 | uVar3 << 0x20 - bVar5);
  auVar6 = vminss_avx(ZEXT416((uint)(auVar6._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
  auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),auVar6,ZEXT416(0xbf800000));
  local_28 = auVar9._0_4_;
  auVar6 = vinsertps_avx(local_58,auVar11._0_16_,0x10);
  auVar14._0_4_ = fVar8 * auVar6._0_4_;
  auVar14._4_4_ = fVar8 * auVar6._4_4_;
  auVar14._8_4_ = fVar8 * auVar6._8_4_;
  auVar14._12_4_ = fVar8 * auVar6._12_4_;
  auVar10._0_4_ = auVar14._0_4_ * auVar14._0_4_;
  auVar10._4_4_ = auVar14._4_4_ * auVar14._4_4_;
  auVar10._8_4_ = auVar14._8_4_ * auVar14._8_4_;
  auVar10._12_4_ = auVar14._12_4_ * auVar14._12_4_;
  auVar6 = vhaddps_avx(auVar10,auVar10);
  fVar8 = auVar6._0_4_ + local_28 * local_28;
  if (fVar8 < 0.0) {
    fVar8 = sqrtf(fVar8);
  }
  else {
    auVar6 = vsqrtss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
    fVar8 = auVar6._0_4_;
  }
  auVar13._4_4_ = fVar8;
  auVar13._0_4_ = fVar8;
  auVar13._8_4_ = fVar8;
  auVar13._12_4_ = fVar8;
  auVar6 = vdivps_avx(auVar14,auVar13);
  uVar1 = vmovlps_avx(auVar6);
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.z = local_28 / fVar8;
  __return_storage_ptr__->cosTheta = auVar7._0_4_;
  __return_storage_ptr__->empty = false;
  return __return_storage_ptr__;
}

Assistant:

DirectionCone RandomCone(RNG &rng) {
    Vector3f w = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
    return DirectionCone(w, -1 + 2 * rng.Uniform<Float>());
}